

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
psy::C::Compilation::CompilationImpl::CompilationImpl(CompilationImpl *this,Compilation *q)

{
  VoidType *this_00;
  BasicType *pBVar1;
  ErrorType *this_01;
  ProgramSymbol *this_02;
  Compilation *q_local;
  CompilationImpl *this_local;
  
  this->Q_ = q;
  std::__cxx11::string::string((string *)&this->id_);
  PlatformOptions::PlatformOptions(&this->platformOpts_);
  InferenceOptions::InferenceOptions(&this->inferOpts_);
  this_00 = (VoidType *)operator_new(0x10);
  VoidType::VoidType(this_00);
  std::unique_ptr<psy::C::VoidType,std::default_delete<psy::C::VoidType>>::
  unique_ptr<std::default_delete<psy::C::VoidType>,void>
            ((unique_ptr<psy::C::VoidType,std::default_delete<psy::C::VoidType>> *)&this->tyVoid_,
             this_00);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyChar_,
             pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char_S);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyCharS_
             ,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Char_U);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyCharU_
             ,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Short_S);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyShortS_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Short_U);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyShortU_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Int_S);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyIntS_,
             pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Int_U);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyIntU_,
             pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Long_S);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyLongS_
             ,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Long_U);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyLongU_
             ,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongLong_S);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyLongLongS_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongLong_U);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyLongLongU_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Float);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyFloat_
             ,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Double);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyDouble_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongDouble);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyLongDouble_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,FloatComplex);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyFloatComplex_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,DoubleComplex);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyDoubleComplex_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,LongDoubleComplex);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)
             &this->tyLongDoubleComplex_,pBVar1);
  pBVar1 = (BasicType *)operator_new(0x10);
  BasicType::BasicType(pBVar1,Bool);
  std::unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>>::
  unique_ptr<std::default_delete<psy::C::BasicType>,void>
            ((unique_ptr<psy::C::BasicType,std::default_delete<psy::C::BasicType>> *)&this->tyBool_,
             pBVar1);
  this_01 = (ErrorType *)operator_new(0x10);
  ErrorType::ErrorType(this_01);
  std::unique_ptr<psy::C::ErrorType,std::default_delete<psy::C::ErrorType>>::
  unique_ptr<std::default_delete<psy::C::ErrorType>,void>
            ((unique_ptr<psy::C::ErrorType,std::default_delete<psy::C::ErrorType>> *)&this->tyErr_,
             this_01);
  this_02 = (ProgramSymbol *)operator_new(0x10);
  ProgramSymbol::ProgramSymbol(this_02);
  std::unique_ptr<psy::C::ProgramSymbol,std::default_delete<psy::C::ProgramSymbol>>::
  unique_ptr<std::default_delete<psy::C::ProgramSymbol>,void>
            ((unique_ptr<psy::C::ProgramSymbol,std::default_delete<psy::C::ProgramSymbol>> *)
             &this->prog_,this_02);
  std::
  unordered_map<const_psy::C::SyntaxTree_*,_bool,_std::hash<const_psy::C::SyntaxTree_*>,_std::equal_to<const_psy::C::SyntaxTree_*>,_std::allocator<std::pair<const_psy::C::SyntaxTree_*const,_bool>_>_>
  ::unordered_map(&this->isDirty_);
  std::
  unordered_map<const_psy::C::SyntaxTree_*,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>,_std::hash<const_psy::C::SyntaxTree_*>,_std::equal_to<const_psy::C::SyntaxTree_*>,_std::allocator<std::pair<const_psy::C::SyntaxTree_*const,_std::unique_ptr<psy::C::SemanticModel,_std::default_delete<psy::C::SemanticModel>_>_>_>_>
  ::unordered_map(&this->semaModels_);
  return;
}

Assistant:

CompilationImpl(Compilation* q)
        : Q_(q)
        , tyVoid_(new VoidType)
        , tyChar_(new BasicType(BasicTypeKind::Char))
        , tyCharS_(new BasicType(BasicTypeKind::Char_S))
        , tyCharU_(new BasicType(BasicTypeKind::Char_U))
        , tyShortS_(new BasicType(BasicTypeKind::Short_S))
        , tyShortU_(new BasicType(BasicTypeKind::Short_U))
        , tyIntS_(new BasicType(BasicTypeKind::Int_S))
        , tyIntU_(new BasicType(BasicTypeKind::Int_U))
        , tyLongS_(new BasicType(BasicTypeKind::Long_S))
        , tyLongU_(new BasicType(BasicTypeKind::Long_U))
        , tyLongLongS_(new BasicType(BasicTypeKind::LongLong_S))
        , tyLongLongU_(new BasicType(BasicTypeKind::LongLong_U))
        , tyFloat_(new BasicType(BasicTypeKind::Float))
        , tyDouble_(new BasicType(BasicTypeKind::Double))
        , tyLongDouble_(new BasicType(BasicTypeKind::LongDouble))
        , tyFloatComplex_(new BasicType(BasicTypeKind::FloatComplex))
        , tyDoubleComplex_(new BasicType(BasicTypeKind::DoubleComplex))
        , tyLongDoubleComplex_(new BasicType(BasicTypeKind::LongDoubleComplex))
        , tyBool_(new BasicType(BasicTypeKind::Bool))
        , tyErr_(new ErrorType())
        , prog_(new ProgramSymbol)
    {}